

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O0

void __thiscall AST::ASTBuilder::handle(ASTBuilder *this,string *action,string *LHS)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_70 [8];
  string arg;
  undefined1 local_40 [8];
  string action_number;
  string *LHS_local;
  string *action_local;
  ASTBuilder *this_local;
  
  if ((this->isIgnoreModeOn & 1U) == 0) {
    action_number.field_2._8_8_ = LHS;
    std::__cxx11::string::substr((ulong)local_40,(ulong)action);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"@1");
    if (bVar1) {
      uVar2 = std::__cxx11::string::size();
      if (uVar2 < 3) {
        createNode(this,(string *)action_number.field_2._8_8_);
      }
      else {
        std::__cxx11::string::substr((ulong)local_70,(ulong)action);
        createNode(this,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"@2");
      if (bVar1) {
        insertRightChild(this);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"@3");
        if (bVar1) {
          adoptChild(this);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"@4");
          if (bVar1) {
            insertLeftChild(this);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"@5");
            if (bVar1) {
              constructListAndInsertAsChild(this);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"@6");
              if (bVar1) {
                std::
                stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>
                ::pop(&this->stack);
              }
              else {
                removeSelfIfOnlyHasOneChild(this);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void AST::ASTBuilder::handle(std::string &action, std::string &LHS) {
    if (isIgnoreModeOn) return;
    std::string action_number = action.substr(0, 2);
    if (action_number == "@1") {
        //Extract #optiona_custom_name for the AST node.
        if (action.size() > 2) {
            std::string arg = action.substr(4);
            createNode(arg);
        } else createNode(LHS);
    } else if (action_number == "@2") insertRightChild();
    else if (action_number == "@3") adoptChild();
    else if (action_number == "@4") insertLeftChild();
    else if (action_number == "@5") constructListAndInsertAsChild();
    else if (action_number == "@6") stack.pop();
    else removeSelfIfOnlyHasOneChild();
}